

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O0

CURLcode Curl_proxy_connect(connectdata *conn)

{
  void *pvVar1;
  CURLcode CVar2;
  CURLcode result;
  void *prot_save;
  HTTP http_proxy;
  connectdata *conn_local;
  
  if ((((conn->bits).tunnel_proxy & 1U) != 0) && (((conn->bits).httpproxy & 1U) != 0)) {
    pvVar1 = (conn->data->req).protop;
    http_proxy.send_buffer = conn;
    memset(&prot_save,0,0x88);
    *(void ***)(*http_proxy.send_buffer + 0x1a8) = &prot_save;
    *(undefined1 *)((long)http_proxy.send_buffer + 0x288) = 0;
    CVar2 = Curl_proxyCONNECT((connectdata *)http_proxy.send_buffer,0,
                              *(char **)((long)http_proxy.send_buffer + 0xc0),
                              *(int *)((long)http_proxy.send_buffer + 0xf8));
    *(void **)(*http_proxy.send_buffer + 0x1a8) = pvVar1;
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_proxy_connect(struct connectdata *conn)
{
  if(conn->bits.tunnel_proxy && conn->bits.httpproxy) {
#ifndef CURL_DISABLE_PROXY
    /* for [protocol] tunneled through HTTP proxy */
    struct HTTP http_proxy;
    void *prot_save;
    CURLcode result;

    /* BLOCKING */
    /* We want "seamless" operations through HTTP proxy tunnel */

    /* Curl_proxyCONNECT is based on a pointer to a struct HTTP at the
     * member conn->proto.http; we want [protocol] through HTTP and we have
     * to change the member temporarily for connecting to the HTTP
     * proxy. After Curl_proxyCONNECT we have to set back the member to the
     * original pointer
     *
     * This function might be called several times in the multi interface case
     * if the proxy's CONNTECT response is not instant.
     */
    prot_save = conn->data->req.protop;
    memset(&http_proxy, 0, sizeof(http_proxy));
    conn->data->req.protop = &http_proxy;
    connkeep(conn, "HTTP proxy CONNECT");
    result = Curl_proxyCONNECT(conn, FIRSTSOCKET,
                               conn->host.name, conn->remote_port);
    conn->data->req.protop = prot_save;
    if(CURLE_OK != result)
      return result;
#else
    return CURLE_NOT_BUILT_IN;
#endif
  }
  /* no HTTP tunnel proxy, just return */
  return CURLE_OK;
}